

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxu.c
# Opt level: O3

void Fxu_MatrixRingCubesUnmark(Fxu_Matrix *p)

{
  Fxu_Cube *pFVar1;
  Fxu_Cube *pFVar2;
  
  pFVar1 = p->pOrderCubes;
  if ((pFVar1 != (Fxu_Cube *)0x0) && (pFVar1 != (Fxu_Cube *)0x1)) {
    pFVar2 = pFVar1->pOrder;
    pFVar1->pOrder = (Fxu_Cube *)0x0;
    while (pFVar2 != (Fxu_Cube *)0x1) {
      pFVar1 = pFVar2->pOrder;
      pFVar2->pOrder = (Fxu_Cube *)0x0;
      pFVar2 = pFVar1;
    }
  }
  p->pOrderCubes = (Fxu_Cube *)0x0;
  p->ppTailCubes = (Fxu_Cube **)0x0;
  return;
}

Assistant:

void Fxu_MatrixRingCubesUnmark( Fxu_Matrix * p )
{
	Fxu_Cube * pCube, * pCube2;
    // unmark the cubes
    Fxu_MatrixForEachCubeInRingSafe( p, pCube, pCube2 )
        pCube->pOrder = NULL;
    Fxu_MatrixRingCubesReset( p );
}